

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

string * __thiscall
soul::StructuralParser::parseAnnotationKey_abi_cxx11_
          (string *__return_storage_ptr__,StructuralParser *this)

{
  bool bVar1;
  allocator<char> local_351;
  char *local_350;
  allocator<char> local_341;
  char *local_340;
  allocator<char> local_331;
  char *local_330;
  allocator<char> local_321;
  char *local_320;
  allocator<char> local_311;
  char *local_310;
  allocator<char> local_301;
  char *local_300;
  allocator<char> local_2f1;
  char *local_2f0;
  allocator<char> local_2e1;
  char *local_2e0;
  allocator<char> local_2d1;
  char *local_2d0;
  allocator<char> local_2c1;
  char *local_2c0;
  allocator<char> local_2b1;
  char *local_2b0;
  allocator<char> local_2a1;
  char *local_2a0;
  allocator<char> local_291;
  char *local_290;
  allocator<char> local_281;
  char *local_280;
  allocator<char> local_271;
  char *local_270;
  allocator<char> local_261;
  char *local_260;
  allocator<char> local_251;
  char *local_250;
  allocator<char> local_241;
  char *local_240;
  allocator<char> local_231;
  char *local_230;
  allocator<char> local_221;
  char *local_220;
  allocator<char> local_211;
  char *local_210;
  allocator<char> local_201;
  char *local_200;
  allocator<char> local_1f1;
  char *local_1f0;
  allocator<char> local_1e1;
  char *local_1e0;
  allocator<char> local_1d1;
  char *local_1d0;
  allocator<char> local_1c1;
  char *local_1c0;
  allocator<char> local_1b1;
  char *local_1b0;
  allocator<char> local_1a1;
  char *local_1a0;
  allocator<char> local_191;
  char *local_190;
  allocator<char> local_181;
  char *local_180;
  allocator<char> local_171;
  char *local_170;
  allocator<char> local_161;
  char *local_160;
  allocator<char> local_151;
  char *local_150;
  allocator<char> local_141;
  char *local_140;
  allocator<char> local_131;
  char *local_130;
  allocator<char> local_121;
  char *local_120;
  allocator<char> local_111;
  char *local_110;
  allocator<char> local_101;
  char *local_100;
  allocator<char> local_f1;
  char *local_f0;
  allocator<char> local_e1;
  char *local_e0;
  allocator<char> local_d1;
  char *local_d0;
  allocator<char> local_c1;
  char *local_c0;
  allocator<char> local_b1;
  char *local_b0;
  allocator<char> local_a1;
  char *local_a0;
  allocator<char> local_91;
  char *local_90;
  allocator<char> local_81;
  char *local_80;
  allocator<char> local_71;
  char *local_70;
  allocator<char> local_61;
  char *local_60;
  allocator<char> local_51;
  char *local_50;
  allocator<char> local_31;
  char *local_30;
  char *local_28;
  char *local_20;
  StructuralParser *local_18;
  StructuralParser *this_local;
  
  local_20 = "$identifier";
  local_28 = "$string literal";
  local_18 = this;
  this_local = (StructuralParser *)__return_storage_ptr__;
  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchesAny<soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)"$identifier",(TokenType)"$string literal");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&(this->super_SOULTokeniser).currentStringValue);
  }
  else {
    local_30 = "if";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x573a3e);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"if",&local_31);
      std::allocator<char>::~allocator(&local_31);
    }
    else {
      local_50 = "do";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)"do");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"do",&local_51);
        std::allocator<char>::~allocator(&local_51);
      }
      else {
        local_60 = "for";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x573504);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"for",&local_61);
          std::allocator<char>::~allocator(&local_61);
        }
        else {
          local_70 = "let";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)"let");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"let",&local_71);
            std::allocator<char>::~allocator(&local_71);
          }
          else {
            local_80 = "var";
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)"var");
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"var",&local_81);
              std::allocator<char>::~allocator(&local_81);
            }
            else {
              local_90 = "int";
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)0x570d9c);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,"int",&local_91);
                std::allocator<char>::~allocator(&local_91);
              }
              else {
                local_a0 = "try";
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)"try");
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,"try",&local_a1);
                  std::allocator<char>::~allocator(&local_a1);
                }
                else {
                  local_b0 = "else";
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)"else");
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"else",&local_b1);
                    std::allocator<char>::~allocator(&local_b1);
                  }
                  else {
                    local_c0 = "bool";
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matches(&this->super_SOULTokeniser,(TokenType)0x54e242);
                    if (bVar1) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,"bool",&local_c1);
                      std::allocator<char>::~allocator(&local_c1);
                    }
                    else {
                      local_d0 = "true";
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matches(&this->super_SOULTokeniser,(TokenType)0x571d88);
                      if (bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,"true",&local_d1);
                        std::allocator<char>::~allocator(&local_d1);
                      }
                      else {
                        local_e0 = "case";
                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::matches(&this->super_SOULTokeniser,(TokenType)"case");
                        if (bVar1) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,"case",&local_e1);
                          std::allocator<char>::~allocator(&local_e1);
                        }
                        else {
                          local_f0 = "enum";
                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::matches(&this->super_SOULTokeniser,(TokenType)"enum");
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,"enum",&local_f1);
                            std::allocator<char>::~allocator(&local_f1);
                          }
                          else {
                            local_100 = "loop";
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matches(&this->super_SOULTokeniser,(TokenType)0x572700);
                            if (bVar1) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)__return_storage_ptr__,"loop",&local_101);
                              std::allocator<char>::~allocator(&local_101);
                            }
                            else {
                              local_110 = "void";
                              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                      ::matches(&this->super_SOULTokeniser,(TokenType)0x54e17f);
                              if (bVar1) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)__return_storage_ptr__,"void",&local_111);
                                std::allocator<char>::~allocator(&local_111);
                              }
                              else {
                                local_120 = "while";
                                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                        ::matches(&this->super_SOULTokeniser,(TokenType)"while");
                                if (bVar1) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)__return_storage_ptr__,"while",&local_121);
                                  std::allocator<char>::~allocator(&local_121);
                                }
                                else {
                                  local_130 = "break";
                                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                          ::matches(&this->super_SOULTokeniser,(TokenType)"break");
                                  if (bVar1) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)__return_storage_ptr__,"break",&local_131);
                                    std::allocator<char>::~allocator(&local_131);
                                  }
                                  else {
                                    local_140 = "const";
                                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                            ::matches(&this->super_SOULTokeniser,(TokenType)0x56f861
                                                     );
                                    if (bVar1) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,"const",&local_141
                                                );
                                      std::allocator<char>::~allocator(&local_141);
                                    }
                                    else {
                                      local_150 = "int32";
                                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                              ::matches(&this->super_SOULTokeniser,
                                                        (TokenType)0x54e1e9);
                                      if (bVar1) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)__return_storage_ptr__,"int32",
                                                   &local_151);
                                        std::allocator<char>::~allocator(&local_151);
                                      }
                                      else {
                                        local_160 = "int64";
                                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                ::matches(&this->super_SOULTokeniser,
                                                          (TokenType)0x54e1ff);
                                        if (bVar1) {
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)__return_storage_ptr__,"int64",
                                                     &local_161);
                                          std::allocator<char>::~allocator(&local_161);
                                        }
                                        else {
                                          local_170 = "float";
                                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"float");
                                          if (bVar1) {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)__return_storage_ptr__,"float",
                                                       &local_171);
                                            std::allocator<char>::~allocator(&local_171);
                                          }
                                          else {
                                            local_180 = "false";
                                            bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x571dbc);
                                            if (bVar1) {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)__return_storage_ptr__,"false",
                                                         &local_181);
                                              std::allocator<char>::~allocator(&local_181);
                                            }
                                            else {
                                              local_190 = "using";
                                              bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"using");
                                              if (bVar1) {
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)__return_storage_ptr__,"using",
                                                           &local_191);
                                                std::allocator<char>::~allocator(&local_191);
                                              }
                                              else {
                                                local_1a0 = "fixed";
                                                bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"fixed");
                                                if (bVar1) {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)__return_storage_ptr__,
                                                             "fixed",&local_1a1);
                                                  std::allocator<char>::~allocator(&local_1a1);
                                                }
                                                else {
                                                  local_1b0 = "graph";
                                                  bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x571c05);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "graph",&local_1b1);
                                                    std::allocator<char>::~allocator(&local_1b1);
                                                  }
                                                  else {
                                                    local_1c0 = "input";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x54a795);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "input",&local_1c1);
                                                    std::allocator<char>::~allocator(&local_1c1);
                                                  }
                                                  else {
                                                    local_1d0 = "event";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"event");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "event",&local_1d1);
                                                    std::allocator<char>::~allocator(&local_1d1);
                                                  }
                                                  else {
                                                    local_1e0 = "class";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"class");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "class",&local_1e1);
                                                    std::allocator<char>::~allocator(&local_1e1);
                                                  }
                                                  else {
                                                    local_1f0 = "catch";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"catch");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "catch",&local_1f1);
                                                    std::allocator<char>::~allocator(&local_1f1);
                                                  }
                                                  else {
                                                    local_200 = "throw";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"throw");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "throw",&local_201);
                                                    std::allocator<char>::~allocator(&local_201);
                                                  }
                                                  else {
                                                    local_210 = "output";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x5733cd);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "output",&local_211);
                                                    std::allocator<char>::~allocator(&local_211);
                                                  }
                                                  else {
                                                    local_220 = "return";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"return");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "return",&local_221);
                                                    std::allocator<char>::~allocator(&local_221);
                                                  }
                                                  else {
                                                    local_230 = "string";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x54e274);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "string",&local_231);
                                                    std::allocator<char>::~allocator(&local_231);
                                                  }
                                                  else {
                                                    local_240 = "struct";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x5717af);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "struct",&local_241);
                                                    std::allocator<char>::~allocator(&local_241);
                                                  }
                                                  else {
                                                    local_250 = "import";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"import");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "import",&local_251);
                                                    std::allocator<char>::~allocator(&local_251);
                                                  }
                                                  else {
                                                    local_260 = "switch";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"switch");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "switch",&local_261);
                                                    std::allocator<char>::~allocator(&local_261);
                                                  }
                                                  else {
                                                    local_270 = "public";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"public");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "public",&local_271);
                                                    std::allocator<char>::~allocator(&local_271);
                                                  }
                                                  else {
                                                    local_280 = "double";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"double");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "double",&local_281);
                                                    std::allocator<char>::~allocator(&local_281);
                                                  }
                                                  else {
                                                    local_290 = "private";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"private");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "private",&local_291);
                                                    std::allocator<char>::~allocator(&local_291);
                                                  }
                                                  else {
                                                    local_2a0 = "float32";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x54e214);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "float32",&local_2a1);
                                                    std::allocator<char>::~allocator(&local_2a1);
                                                  }
                                                  else {
                                                    local_2b0 = "float64";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x54e22b);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "float64",&local_2b1);
                                                    std::allocator<char>::~allocator(&local_2b1);
                                                  }
                                                  else {
                                                    local_2c0 = "default";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"default");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "default",&local_2c1);
                                                    std::allocator<char>::~allocator(&local_2c1);
                                                  }
                                                  else {
                                                    local_2d0 = "complex";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x54d548);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "complex",&local_2d1);
                                                    std::allocator<char>::~allocator(&local_2d1);
                                                  }
                                                  else {
                                                    local_2e0 = "continue";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"continue");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "continue",&local_2e1);
                                                    std::allocator<char>::~allocator(&local_2e1);
                                                  }
                                                  else {
                                                    local_2f0 = "external";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"external");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "external",&local_2f1);
                                                    std::allocator<char>::~allocator(&local_2f1);
                                                  }
                                                  else {
                                                    local_300 = "operator";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x571f4a);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "operator",&local_301);
                                                    std::allocator<char>::~allocator(&local_301);
                                                  }
                                                  else {
                                                    local_310 = "processor";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x570035);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "processor",&local_311);
                                                    std::allocator<char>::~allocator(&local_311);
                                                  }
                                                  else {
                                                    local_320 = "namespace";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x56fab0);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "namespace",&local_321);
                                                    std::allocator<char>::~allocator(&local_321);
                                                  }
                                                  else {
                                                    local_330 = "complex32";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"complex32");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "complex32",&local_331);
                                                    std::allocator<char>::~allocator(&local_331);
                                                  }
                                                  else {
                                                    local_340 = "complex64";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)"complex64");
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "complex64",&local_341);
                                                    std::allocator<char>::~allocator(&local_341);
                                                  }
                                                  else {
                                                    local_350 = "connection";
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x570851);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               "connection",&local_351);
                                                    std::allocator<char>::~allocator(&local_351);
                                                  }
                                                  else {
                                                                                                        
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::expect<soul::TokenType>
                                                            (&this->super_SOULTokeniser,
                                                             (TokenType)"$identifier");
                                                  std::__cxx11::string::string
                                                            ((string *)__return_storage_ptr__);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseAnnotationKey()
    {
        if (matchesAny (Token::identifier, Token::literalString))
            return currentStringValue;

        #define SOUL_CHECK_KEYWORD(name, str) if (matches (Keyword::name)) return str;
        SOUL_KEYWORDS (SOUL_CHECK_KEYWORD)
        #undef SOUL_CHECK_KEYWORD

        expect (Token::identifier);
        return {};
    }